

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Detect.cpp
# Opt level: O0

bool overlapCC(SoftCluster *c1,SoftCluster *c2)

{
  allocator<SoftNode> *this;
  pointer *this_00;
  bool bVar1;
  int iVar2;
  const_iterator __first;
  const_iterator __last;
  size_type sVar3;
  reference pvVar4;
  reference pSVar5;
  size_type sVar6;
  long lVar7;
  double dVar8;
  undefined1 auVar9 [16];
  double avgScore;
  undefined1 local_4e0 [4];
  int here;
  SoftNode n2;
  iterator __end2;
  iterator __begin2;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range2;
  SoftNode n1;
  iterator __end1_4;
  iterator __begin1_4;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1_4;
  int i_1;
  int i;
  vector<SoftNode,_std::allocator<SoftNode>_> down3;
  vector<SoftNode,_std::allocator<SoftNode>_> up3;
  _Self local_380;
  _Self local_378;
  undefined1 local_370 [8];
  SoftNode sn_3;
  iterator __end1_3;
  iterator __begin1_3;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1_3;
  _Self local_2d8;
  undefined1 local_2d0 [8];
  SoftNode sn_2;
  iterator __end1_2;
  iterator __begin1_2;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1_2;
  int srCo;
  undefined1 local_228 [8];
  SoftNode sn_1;
  iterator __end1_1;
  iterator __begin1_1;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1_1;
  undefined1 local_188 [8];
  SoftNode sn;
  iterator __end1;
  iterator __begin1;
  vector<SoftNode,_std::allocator<SoftNode>_> *__range1;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stDown;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  stUp;
  undefined1 local_80 [8];
  vector<SoftNode,_std::allocator<SoftNode>_> down;
  allocator<SoftNode> local_51;
  __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_> local_50;
  __normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_> local_48;
  undefined1 local_40 [8];
  vector<SoftNode,_std::allocator<SoftNode>_> up;
  int sum;
  SoftCluster *c2_local;
  SoftCluster *c1_local;
  
  up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = 0;
  local_48._M_current =
       (SoftNode *)std::vector<SoftNode,_std::allocator<SoftNode>_>::begin(&c1->nodes);
  local_50._M_current =
       (SoftNode *)std::vector<SoftNode,_std::allocator<SoftNode>_>::end(&c1->nodes);
  std::allocator<SoftNode>::allocator(&local_51);
  std::vector<SoftNode,std::allocator<SoftNode>>::
  vector<__gnu_cxx::__normal_iterator<SoftNode_const*,std::vector<SoftNode,std::allocator<SoftNode>>>,void>
            ((vector<SoftNode,std::allocator<SoftNode>> *)local_40,local_48,local_50,&local_51);
  std::allocator<SoftNode>::~allocator(&local_51);
  __first = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin(&c2->nodes);
  __last = std::vector<SoftNode,_std::allocator<SoftNode>_>::end(&c2->nodes);
  this = (allocator<SoftNode> *)((long)&stUp._M_t._M_impl.super__Rb_tree_header._M_node_count + 7);
  std::allocator<SoftNode>::allocator(this);
  std::vector<SoftNode,std::allocator<SoftNode>>::
  vector<__gnu_cxx::__normal_iterator<SoftNode_const*,std::vector<SoftNode,std::allocator<SoftNode>>>,void>
            ((vector<SoftNode,std::allocator<SoftNode>> *)local_80,
             (__normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
             )__first._M_current,
             (__normal_iterator<const_SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
             )__last._M_current,this);
  std::allocator<SoftNode>::~allocator
            ((allocator<SoftNode> *)
             ((long)&stUp._M_t._M_impl.super__Rb_tree_header._M_node_count + 7));
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&stDown._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)&__range1);
  __end1 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin
                     ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_40);
  sn._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end
                         ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                                     *)&sn.scAtRight), bVar1) {
    pSVar5 = __gnu_cxx::
             __normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
             operator*(&__end1);
    SoftNode::SoftNode((SoftNode *)local_188,pSVar5);
    if ((sn.readName.field_2._M_local_buf[9] & 1U) == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&stDown._M_t._M_impl.super__Rb_tree_header._M_node_count,
               (value_type *)((long)&sn.seq.field_2 + 8));
    }
    SoftNode::~SoftNode((SoftNode *)local_188);
    __gnu_cxx::__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
    operator++(&__end1);
  }
  __end1_1 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin
                       ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_80);
  sn_1._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end
                           ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_80);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                             *)&sn_1.scAtRight), bVar1) {
    pSVar5 = __gnu_cxx::
             __normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
             operator*(&__end1_1);
    SoftNode::SoftNode((SoftNode *)local_228,pSVar5);
    if ((sn_1.readName.field_2._M_local_buf[9] & 1U) == 0) {
      std::
      set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&__range1,(value_type *)((long)&sn_1.seq.field_2 + 8));
    }
    SoftNode::~SoftNode((SoftNode *)local_228);
    __gnu_cxx::__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
    operator++(&__end1_1);
  }
  __range1_2._4_4_ = 0;
  __end1_2 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin
                       ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_40);
  sn_2._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end
                           ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_40);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                             *)&sn_2.scAtRight), bVar1) {
    pSVar5 = __gnu_cxx::
             __normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
             operator*(&__end1_2);
    SoftNode::SoftNode((SoftNode *)local_2d0,pSVar5);
    if ((sn_2.readName.field_2._M_local_buf[9] & 1U) != 0) {
      local_2d8._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&__range1,(key_type *)((long)&sn_2.seq.field_2 + 8));
      __range1_3 = (vector<SoftNode,_std::allocator<SoftNode>_> *)
                   std::
                   set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&__range1);
      bVar1 = std::operator!=(&local_2d8,(_Self *)&__range1_3);
      if (bVar1) {
        __range1_2._4_4_ = __range1_2._4_4_ + 1;
      }
    }
    SoftNode::~SoftNode((SoftNode *)local_2d0);
    __gnu_cxx::__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
    operator++(&__end1_2);
  }
  __end1_3 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin
                       ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_80);
  sn_3._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end
                           ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_80);
  while (bVar1 = __gnu_cxx::operator!=
                           (&__end1_3,
                            (__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                             *)&sn_3.scAtRight), bVar1) {
    pSVar5 = __gnu_cxx::
             __normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
             operator*(&__end1_3);
    SoftNode::SoftNode((SoftNode *)local_370,pSVar5);
    if ((sn_3.readName.field_2._M_local_buf[9] & 1U) != 0) {
      local_378._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::find((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   *)&stDown._M_t._M_impl.super__Rb_tree_header._M_node_count,
                  (key_type *)((long)&sn_3.seq.field_2 + 8));
      local_380._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&stDown._M_t._M_impl.super__Rb_tree_header._M_node_count);
      bVar1 = std::operator!=(&local_378,&local_380);
      if (bVar1) {
        __range1_2._4_4_ = __range1_2._4_4_ + 1;
      }
    }
    SoftNode::~SoftNode((SoftNode *)local_370);
    __gnu_cxx::__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
    operator++(&__end1_3);
  }
  if (__range1_2._4_4_ < MIN_SPLIT_SUPPORT) {
    std::vector<SoftNode,_std::allocator<SoftNode>_>::vector
              ((vector<SoftNode,_std::allocator<SoftNode>_> *)
               &down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
    std::vector<SoftNode,_std::allocator<SoftNode>_>::vector
              ((vector<SoftNode,_std::allocator<SoftNode>_> *)&i_1);
    sVar3 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size
                      ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_40);
    __range1_4._4_4_ = (int)sVar3;
    do {
      __range1_4._4_4_ = __range1_4._4_4_ + -1;
      if (__range1_4._4_4_ < 0) break;
      pvVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::at
                         ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_40,
                          (long)__range1_4._4_4_);
      if ((pvVar4->isSC & 1U) != 0) {
        pvVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::at
                           ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_40,
                            (long)__range1_4._4_4_);
        std::vector<SoftNode,std::allocator<SoftNode>>::emplace_back<SoftNode&>
                  ((vector<SoftNode,std::allocator<SoftNode>> *)
                   &down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage,pvVar4);
      }
      sVar3 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size
                        ((vector<SoftNode,_std::allocator<SoftNode>_> *)
                         &down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    } while (sVar3 < 3);
    sVar3 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size
                      ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_80);
    __range1_4._0_4_ = (int)sVar3;
    do {
      __range1_4._0_4_ = (int)__range1_4 + -1;
      if ((int)__range1_4 < 0) break;
      pvVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::at
                         ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_80,
                          (long)(int)__range1_4);
      if ((pvVar4->isSC & 1U) != 0) {
        pvVar4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::at
                           ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_80,
                            (long)(int)__range1_4);
        std::vector<SoftNode,std::allocator<SoftNode>>::emplace_back<SoftNode&>
                  ((vector<SoftNode,std::allocator<SoftNode>> *)&i_1,pvVar4);
      }
      sVar3 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size
                        ((vector<SoftNode,_std::allocator<SoftNode>_> *)&i_1);
    } while (sVar3 < 3);
    this_00 = &down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    __end1_4 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin
                         ((vector<SoftNode,_std::allocator<SoftNode>_> *)this_00);
    n1._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end
                           ((vector<SoftNode,_std::allocator<SoftNode>_> *)this_00);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1_4,
                              (__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                               *)&n1.scAtRight), bVar1) {
      pSVar5 = __gnu_cxx::
               __normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
               operator*(&__end1_4);
      SoftNode::SoftNode((SoftNode *)&__range2,pSVar5);
      __end2 = std::vector<SoftNode,_std::allocator<SoftNode>_>::begin
                         ((vector<SoftNode,_std::allocator<SoftNode>_> *)&i_1);
      n2._112_8_ = std::vector<SoftNode,_std::allocator<SoftNode>_>::end
                             ((vector<SoftNode,_std::allocator<SoftNode>_> *)&i_1);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end2,(__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
                                         *)&n2.scAtRight), bVar1) {
        pSVar5 = __gnu_cxx::
                 __normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
                 operator*(&__end2);
        SoftNode::SoftNode((SoftNode *)local_4e0,pSVar5);
        iVar2 = alignSeq((string *)((long)&n1.refName.field_2 + 8),
                         (string *)((long)&n2.refName.field_2 + 8));
        up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage._4_4_ =
             iVar2 + up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage._4_4_;
        SoftNode::~SoftNode((SoftNode *)local_4e0);
        __gnu_cxx::__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>
        ::operator++(&__end2);
      }
      SoftNode::~SoftNode((SoftNode *)&__range2);
      __gnu_cxx::__normal_iterator<SoftNode_*,_std::vector<SoftNode,_std::allocator<SoftNode>_>_>::
      operator++(&__end1_4);
    }
    dVar8 = (double)up.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage._4_4_;
    sVar3 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size
                      ((vector<SoftNode,_std::allocator<SoftNode>_> *)
                       &down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage);
    sVar6 = std::vector<SoftNode,_std::allocator<SoftNode>_>::size
                      ((vector<SoftNode,_std::allocator<SoftNode>_> *)&i_1);
    lVar7 = sVar3 + sVar6;
    auVar9._8_4_ = (int)((ulong)lVar7 >> 0x20);
    auVar9._0_8_ = lVar7;
    auVar9._12_4_ = 0x45300000;
    c1_local._7_1_ =
         (double)INTRA_ALIGN_SCORE <=
         dVar8 / ((auVar9._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)lVar7) - 4503599627370496.0));
    std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector
              ((vector<SoftNode,_std::allocator<SoftNode>_> *)&i_1);
    std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector
              ((vector<SoftNode,_std::allocator<SoftNode>_> *)
               &down3.super__Vector_base<SoftNode,_std::allocator<SoftNode>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage);
  }
  else {
    c1_local._7_1_ = true;
  }
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&__range1);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)&stDown._M_t._M_impl.super__Rb_tree_header._M_node_count);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector
            ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_80);
  std::vector<SoftNode,_std::allocator<SoftNode>_>::~vector
            ((vector<SoftNode,_std::allocator<SoftNode>_> *)local_40);
  return c1_local._7_1_;
}

Assistant:

bool overlapCC(const SoftCluster &c1, const SoftCluster &c2)
{
	int sum = 0;
	std::vector<SoftNode> up(c1.nodes.begin(), c1.nodes.end());
	std::vector<SoftNode> down(c2.nodes.begin(), c2.nodes.end());

	// check if split read already present
	std::set<std::string> stUp, stDown;
	for (SoftNode sn : up)
	{
		if (!sn.isSC)
			stUp.insert(sn.readName);
	}
	for (SoftNode sn : down)
	{
		if (!sn.isSC)
			stDown.insert(sn.readName);
	}
	int srCo = 0;
	for (SoftNode sn : up)
	{
		if (sn.isSC)
		{
			if (stDown.find(sn.readName) != stDown.end())
				srCo += 1;
		}
	}
	for (SoftNode sn : down)
	{
		if (sn.isSC)
		{
			if (stUp.find(sn.readName) != stUp.end())
				srCo += 1;
		}
	}
	if (srCo >= MIN_SPLIT_SUPPORT)
		return true;

	std::vector<SoftNode> up3, down3;
	for (int i = up.size() - 1; i >= 0; i--)
	{
		if (up.at(i).isSC)
			up3.emplace_back(up.at(i));
		if (up3.size() >= 3)
			break;
	}
	for (int i = down.size() - 1; i >= 0; i--)
	{
		if (down.at(i).isSC)
			down3.emplace_back(down.at(i));
		if (down3.size() >= 3)
			break;
	}

	for (SoftNode n1 : up3)
	{
		for (SoftNode n2 : down3)
		{
			int here = alignSeq(n1.seq, n2.seq);
			sum += here;
		}
	}
	double avgScore = 1.0 * sum / (up3.size() + down3.size());
	return avgScore >= INTRA_ALIGN_SCORE;
}